

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

char * stb_replacedir(char *output,char *src,char *dir)

{
  char local_1028 [8];
  char buffer [4096];
  char *dir_local;
  char *src_local;
  char *output_local;
  
  stb_splitpath(local_1028,src,6);
  if (dir == (char *)0x0) {
    strcpy(output,local_1028);
  }
  else {
    sprintf(output,"%s/%s",dir,local_1028);
  }
  return output;
}

Assistant:

char *stb_replacedir(char *output, char *src, char *dir)
{
   char buffer[4096];
   stb_splitpath(buffer, src, STB_FILE | STB_EXT);
   if (dir)
      sprintf(output, "%s/%s", dir, buffer);
   else
      strcpy(output, buffer);
   return output;
}